

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O0

void helper_sve_sel_zpzz_b_aarch64(void *vd,void *vn,void *vm,void *vg,uint32_t desc)

{
  ulong uVar1;
  ulong uVar2;
  intptr_t iVar3;
  uint64_t uVar4;
  uint64_t pp;
  uint64_t mm;
  uint64_t nn;
  uint8_t *pg;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  intptr_t opr_sz;
  intptr_t i;
  uint32_t desc_local;
  void *vg_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  iVar3 = simd_oprsz(desc);
  for (opr_sz = 0; opr_sz < iVar3 / 8; opr_sz = opr_sz + 1) {
    uVar1 = *(ulong *)((long)vn + opr_sz * 8);
    uVar2 = *(ulong *)((long)vm + opr_sz * 8);
    uVar4 = expand_pred_b(*(uint8_t *)((long)vg + opr_sz));
    *(ulong *)((long)vd + opr_sz * 8) = uVar1 & uVar4 | uVar2 & (uVar4 ^ 0xffffffffffffffff);
  }
  return;
}

Assistant:

void HELPER(sve_sel_zpzz_b)(void *vd, void *vn, void *vm,
                            void *vg, uint32_t desc)
{
    intptr_t i, opr_sz = simd_oprsz(desc) / 8;
    uint64_t *d = vd, *n = vn, *m = vm;
    uint8_t *pg = vg;

    for (i = 0; i < opr_sz; i += 1) {
        uint64_t nn = n[i], mm = m[i];
        uint64_t pp = expand_pred_b(pg[H1(i)]);
        d[i] = (nn & pp) | (mm & ~pp);
    }
}